

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyHexStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  ushort *puVar2;
  uint uVar3;
  ushort **ppuVar4;
  ushort **ppuVar5;
  ushort **ppuVar6;
  ushort **ppuVar7;
  ushort **ppuVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  ushort **local_40;
  
  ppuVar5 = (ushort **)(zSrc + nLen);
  for (; zSrc < ppuVar5; zSrc = (char *)((long)zSrc + 1)) {
    ppuVar4 = __ctype_b_loc();
    cVar1 = *zSrc;
    if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      if ((cVar1 == '+') || (cVar1 == '-')) {
        bVar11 = cVar1 == '-';
        zSrc = (char *)((long)zSrc + 1);
        goto LAB_001197ff;
      }
      break;
    }
  }
  bVar11 = false;
LAB_001197ff:
  ppuVar4 = (ushort **)((long)ppuVar5 - 2);
  if (((zSrc < ppuVar4) && (*zSrc == '0')) &&
     (uVar3 = *(byte *)((long)zSrc + 1) | 0x20, ppuVar4 = (ushort **)(ulong)uVar3, uVar3 == 0x78)) {
    zSrc = (char *)((long)zSrc + 2);
  }
  for (; (zSrc < ppuVar5 && (*zSrc == '0')); zSrc = (char *)((long)zSrc + 1)) {
  }
  ppuVar6 = (ushort **)0x0;
  local_40 = (ushort **)zSrc;
  for (lVar10 = 0; ppuVar8 = (ushort **)((long)zSrc + lVar10), ppuVar7 = ppuVar8, ppuVar8 < ppuVar5;
      lVar10 = lVar10 + 4) {
    ppuVar4 = __ctype_b_loc();
    puVar2 = *ppuVar4;
    ppuVar7 = local_40;
    if (((*(byte *)((long)puVar2 + (long)*(char *)ppuVar8 * 2 + 1) & 0x10) == 0) ||
       (iVar9 = (int)lVar10, 0xf < iVar9)) break;
    uVar3 = SyHexToint((int)*(char *)ppuVar8);
    ppuVar4 = (ushort **)(ulong)uVar3;
    ppuVar6 = (ushort **)((long)(int)uVar3 + (long)ppuVar6 * 0x10);
    ppuVar7 = (ushort **)((long)zSrc + lVar10 + 1);
    if (ppuVar5 <= ppuVar7) {
      ppuVar7 = (ushort **)((long)local_40 + 1);
      break;
    }
    ppuVar4 = (ushort **)(ulong)(iVar9 + 1U);
    if (0xf < (int)(iVar9 + 1U)) break;
    ppuVar4 = (ushort **)(ulong)(puVar2[*(char *)ppuVar7] & 0x1000);
    if ((puVar2[*(char *)ppuVar7] & 0x1000) == 0) break;
    uVar3 = SyHexToint((int)*(char *)ppuVar7);
    ppuVar4 = (ushort **)(ulong)uVar3;
    ppuVar6 = (ushort **)((long)(int)uVar3 + (long)ppuVar6 * 0x10);
    ppuVar8 = (ushort **)((long)zSrc + lVar10 + 2);
    ppuVar7 = ppuVar8;
    if (((ppuVar5 <= ppuVar8) ||
        (ppuVar4 = (ushort **)((long)local_40 + 2), ppuVar7 = ppuVar4, 0xf < iVar9 + 2)) ||
       ((puVar2[*(char *)ppuVar8] & 0x1000) == 0)) break;
    uVar3 = SyHexToint((int)*(char *)ppuVar8);
    ppuVar4 = (ushort **)(ulong)uVar3;
    ppuVar6 = (ushort **)((long)(int)uVar3 + (long)ppuVar6 * 0x10);
    ppuVar7 = (ushort **)((long)zSrc + lVar10 + 3);
    if (ppuVar5 <= ppuVar7) {
      ppuVar7 = (ushort **)((long)local_40 + 3);
      break;
    }
    ppuVar4 = (ushort **)(ulong)(iVar9 + 3U);
    if (0xf < (int)(iVar9 + 3U)) break;
    ppuVar4 = (ushort **)(ulong)(puVar2[*(char *)ppuVar7] & 0x1000);
    if ((puVar2[*(char *)ppuVar7] & 0x1000) == 0) break;
    uVar3 = SyHexToint((int)*(char *)ppuVar7);
    ppuVar4 = (ushort **)(ulong)uVar3;
    ppuVar6 = (ushort **)((long)(int)uVar3 + (long)ppuVar6 * 0x10);
    local_40 = (ushort **)((long)local_40 + 4);
  }
  do {
    if (ppuVar5 <= ppuVar7) break;
    ppuVar4 = __ctype_b_loc();
    ppuVar4 = (ushort **)*ppuVar4;
    cVar1 = *(char *)ppuVar7;
    ppuVar7 = (ushort **)((long)ppuVar7 + 1);
  } while ((*(byte *)((long)ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  if (pOutVal != (void *)0x0) {
    ppuVar4 = (ushort **)-(long)ppuVar6;
    if (ppuVar6 == (ushort **)0x0) {
      ppuVar4 = ppuVar6;
    }
    if (!bVar11) {
      ppuVar4 = ppuVar6;
    }
    *(ushort ***)pOutVal = ppuVar4;
  }
  return (sxi32)ppuVar4;
}

Assistant:

JX9_PRIVATE sxi32 SyHexStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( *zSrc == '-' || *zSrc == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'x' || zSrc[1] == 'X') ){
		/* Bypass hex prefix */
		zSrc += sizeof(char) * 2;
	}	
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}	
	if( zRest ){
		*zRest = zSrc;
	}
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}